

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_makeByteArray
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,size_t elementCount,
               int16_t *elementOperands)

{
  long lVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  undefined6 in_register_00000032;
  size_t byteCount;
  size_t i;
  size_t sVar3;
  uint8_t local_42 [4];
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  uint8_t instruction [3];
  uint8_t local_34 [4];
  uint8_t *bytes;
  
  if (-1 < resultOperand) {
    sysbvm_jit_x86_jitLoadContextInRegister
              (jit,(sysbvm_x86_register_t)CONCAT62(in_register_00000032,resultOperand));
    sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_64_ARG1,(int32_t)elementCount);
    sysbvm_jit_x86_call(jit,sysbvm_byteArray_create);
    uVar2 = extraout_RDX;
    for (sVar3 = 0; elementCount != sVar3; sVar3 = sVar3 + 1) {
      sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,elementOperands[sVar3]);
      local_34[0] = 'H';
      local_34[1] = 0xc1;
      local_34[2] = 0xea;
      local_34[3] = '\x04';
      sysbvm_bytecodeJit_addBytes(jit,4,local_34);
      if ((int)sVar3 == -0x10) {
        instruction[0] = 'H';
        instruction[1] = 0x88;
        instruction[2] = '\x10';
        byteCount = 3;
        bytes = instruction;
      }
      else {
        lVar1 = sVar3 + 0x10;
        local_42[0] = 'H';
        local_42[1] = 0x88;
        local_42[2] = 0x90;
        local_42[3] = (char)sVar3 + '\x10';
        local_3e = (undefined1)((ulong)lVar1 >> 8);
        local_3d = (undefined1)((ulong)lVar1 >> 0x10);
        local_3c = (undefined1)((ulong)lVar1 >> 0x18);
        byteCount = 7;
        bytes = local_42;
      }
      sysbvm_bytecodeJit_addBytes(jit,byteCount,bytes);
      uVar2 = extraout_RDX_00;
    }
    sysbvm_jit_moveRegisterToOperand(jit,resultOperand,(sysbvm_x86_register_t)uVar2);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_makeByteArray(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, size_t elementCount, int16_t *elementOperands)
{
    if(resultOperand < 0)
        return;

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_64_ARG1, (int32_t)elementCount);
    sysbvm_jit_x86_call(jit, &sysbvm_byteArray_create);

    for(size_t i = 0; i < elementCount; ++i)
    {
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, elementOperands[i]);
        sysbvm_jit_x86_logicalShiftRightImmediate(jit, SYSBVM_X86_64_ARG2, SYSBVM_TUPLE_TAG_BIT_COUNT);
        sysbvm_jit_x86_mov8IntoMemoryWithOffset(jit, SYSBVM_X86_RAX, (int32_t) (sizeof(sysbvm_tuple_header_t) + i), SYSBVM_X86_64_ARG2);
    }

    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}